

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope*>::
addAll<capnp::compiler::NodeTranslator::BrandScope**,true>
          (ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope*> *this,BrandScope **start,
          BrandScope **end)

{
  BrandScope **ppBVar1;
  BrandScope **end_local;
  BrandScope **start_local;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> *this_local;
  
  ppBVar1 = _::
            CopyConstructArray_<capnp::compiler::NodeTranslator::BrandScope_*,_capnp::compiler::NodeTranslator::BrandScope_**,_true,_false>
            ::apply(*(BrandScope ***)(this + 8),start,end);
  *(BrandScope ***)(this + 8) = ppBVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}